

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O2

RTPTransmissionInfo * __thiscall
jrtplib::RTPTCPTransmitter::GetTransmissionInfo(RTPTCPTransmitter *this)

{
  RTPTransmissionInfo *pRVar1;
  
  if (this->m_init == true) {
    pRVar1 = (RTPTransmissionInfo *)
             operator_new(0x10,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr,0x1c);
    pRVar1->protocol = TCPProto;
    pRVar1->_vptr_RTPTransmissionInfo = (_func_int **)&PTR__RTPTransmissionInfo_001447b0;
    return pRVar1;
  }
  return (RTPTransmissionInfo *)0x0;
}

Assistant:

RTPTransmissionInfo *RTPTCPTransmitter::GetTransmissionInfo()
{
	if (!m_init)
		return 0;

	MAINMUTEX_LOCK
	RTPTransmissionInfo *tinf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMISSIONINFO) RTPTCPTransmissionInfo();
	MAINMUTEX_UNLOCK
	return tinf;
}